

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::NegativeApiCase::iterate(NegativeApiCase *this)

{
  ostringstream *this_00;
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  NotSupportedError *pNVar4;
  char *description;
  ObjectWrapper *this_01;
  CallLogWrapper gl;
  GLint maxStride;
  GLint maxOffset;
  VertexArray vao;
  Buffer buffer;
  CallLogWrapper local_1f0;
  uint local_1d4;
  ObjectWrapper local_1d0;
  ObjectWrapper local_1b8;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_128 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_1f0,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).m_context)->m_testCtx->m_log);
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar3 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_1b8,(Functions *)CONCAT44(extraout_var_00,iVar1),pOVar3);
  local_1f0.m_enableLog = true;
  glu::CallLogWrapper::glBindVertexArray(&local_1f0,local_1b8.m_object);
  switch(this->m_caseType) {
  case CASE_LARGE_OFFSET:
    local_1d0.m_gl = (Functions *)CONCAT44(local_1d0.m_gl._4_4_,0xffffffff);
    glu::CallLogWrapper::glGetIntegerv(&local_1f0,0x82d9,(GLint *)&local_1d0);
    GVar2 = glu::CallLogWrapper::glGetError(&local_1f0);
    glu::checkError(GVar2,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x5b4);
    if ((~(uint)local_1d0.m_gl & 0x7fffffff) == 0) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1a0._0_8_ = local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"Implementation supports all offsets","");
      tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_1a0);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    glu::CallLogWrapper::glVertexAttribFormat(&local_1f0,0,4,0x1406,'\0',(uint)local_1d0.m_gl + 1);
    break;
  case CASE_LARGE_STRIDE:
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar3 = glu::objectTraits(OBJECTTYPE_BUFFER);
    glu::ObjectWrapper::ObjectWrapper
              (&local_1d0,(Functions *)CONCAT44(extraout_var_03,iVar1),pOVar3);
    local_1d4 = 0xffffffff;
    glu::CallLogWrapper::glGetIntegerv(&local_1f0,0x82e5,(GLint *)&local_1d4);
    GVar2 = glu::CallLogWrapper::glGetError(&local_1f0);
    glu::checkError(GVar2,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x5c7);
    if ((~local_1d4 & 0x7fffffff) == 0) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1a0._0_8_ = local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"Implementation supports all strides","");
      tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_1a0);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    glu::CallLogWrapper::glBindVertexBuffer(&local_1f0,0,local_1d0.m_object,0,local_1d4 + 1);
    this_01 = &local_1d0;
    goto LAB_0153669c;
  case CASE_NEGATIVE_STRIDE:
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar3 = glu::objectTraits(OBJECTTYPE_BUFFER);
    glu::ObjectWrapper::ObjectWrapper
              ((ObjectWrapper *)local_1a0,(Functions *)CONCAT44(extraout_var_01,iVar1),pOVar3);
    glu::CallLogWrapper::glBindVertexBuffer
              (&local_1f0,0,(undefined4)local_190[0]._M_allocated_capacity,0,-0x14);
    goto LAB_015365fa;
  case CASE_NEGATIVE_OFFSET:
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar3 = glu::objectTraits(OBJECTTYPE_BUFFER);
    glu::ObjectWrapper::ObjectWrapper
              ((ObjectWrapper *)local_1a0,(Functions *)CONCAT44(extraout_var_02,iVar1),pOVar3);
    glu::CallLogWrapper::glBindVertexBuffer
              (&local_1f0,0,(undefined4)local_190[0]._M_allocated_capacity,-0x14,0);
LAB_015365fa:
    this_01 = (ObjectWrapper *)local_1a0;
LAB_0153669c:
    glu::ObjectWrapper::~ObjectWrapper(this_01);
    break;
  case CASE_INVALID_ATTR:
    local_1d0.m_gl = (Functions *)CONCAT44(local_1d0.m_gl._4_4_,0xffffffff);
    glu::CallLogWrapper::glGetIntegerv(&local_1f0,0x8869,(GLint *)&local_1d0);
    GVar2 = glu::CallLogWrapper::glGetError(&local_1f0);
    glu::checkError(GVar2,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x5e7);
    if ((~(uint)local_1d0.m_gl & 0x7fffffff) == 0) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1a0._0_8_ = local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"Implementation supports any attribute index","");
      tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_1a0);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    glu::CallLogWrapper::glVertexAttribBinding(&local_1f0,(uint)local_1d0.m_gl + 1,0);
    break;
  case CASE_INVALID_BINDING:
    local_1d0.m_gl = (Functions *)CONCAT44(local_1d0.m_gl._4_4_,0xffffffff);
    glu::CallLogWrapper::glGetIntegerv(&local_1f0,0x82da,(GLint *)&local_1d0);
    GVar2 = glu::CallLogWrapper::glGetError(&local_1f0);
    glu::checkError(GVar2,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x5f9);
    if ((~(uint)local_1d0.m_gl & 0x7fffffff) == 0) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1a0._0_8_ = local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"Implementation supports any binding","");
      tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_1a0);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    glu::CallLogWrapper::glVertexAttribBinding(&local_1f0,0,(uint)local_1d0.m_gl + 1);
  }
  GVar2 = glu::CallLogWrapper::glGetError(&local_1f0);
  if (GVar2 != 0x501) {
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"ERROR! Expected GL_INVALID_VALUE, got ",0x26);
    local_1d0.m_gl = (Functions *)glu::getErrorName;
    local_1d0.m_traits._0_4_ = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1d0,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_128);
    description = "Invalid error";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(GVar2 != 0x501),
             description);
  glu::ObjectWrapper::~ObjectWrapper(&local_1b8);
  glu::CallLogWrapper::~CallLogWrapper(&local_1f0);
  return STOP;
}

Assistant:

NegativeApiCase::IterateResult NegativeApiCase::iterate (void)
{
	glw::GLenum			error;
	glu::CallLogWrapper gl		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	glu::VertexArray	vao		(m_context.getRenderContext());

	gl.enableLogging(true);
	gl.glBindVertexArray(*vao);

	switch (m_caseType)
	{
		case CASE_LARGE_OFFSET:
		{
			glw::GLint	maxOffset	= -1;
			glw::GLint	largeOffset;

			gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET, &maxOffset);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");

			largeOffset = maxOffset + 1;

			// skip if maximum unsigned or signed values
			if (maxOffset == -1 || maxOffset == 0x7FFFFFFF)
				throw tcu::NotSupportedError("Implementation supports all offsets");

			gl.glVertexAttribFormat(0, 4, GL_FLOAT, GL_FALSE, largeOffset);
			break;
		}

		case CASE_LARGE_STRIDE:
		{
			glu::Buffer buffer		(m_context.getRenderContext());
			glw::GLint	maxStride	= -1;
			glw::GLint	largeStride;

			gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_STRIDE, &maxStride);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");

			largeStride = maxStride + 1;

			// skip if maximum unsigned or signed values
			if (maxStride == -1 || maxStride == 0x7FFFFFFF)
				throw tcu::NotSupportedError("Implementation supports all strides");

			gl.glBindVertexBuffer(0, *buffer, 0, largeStride);
			break;
		}

		case CASE_NEGATIVE_STRIDE:
		{
			glu::Buffer buffer(m_context.getRenderContext());
			gl.glBindVertexBuffer(0, *buffer, 0, -20);
			break;
		}

		case CASE_NEGATIVE_OFFSET:
		{
			glu::Buffer buffer(m_context.getRenderContext());
			gl.glBindVertexBuffer(0, *buffer, -20, 0);
			break;
		}

		case CASE_INVALID_ATTR:
		{
			glw::GLint maxIndex = -1;
			glw::GLint largeIndex;

			gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &maxIndex);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");

			largeIndex = maxIndex + 1;

			// skip if maximum unsigned or signed values
			if (maxIndex == -1 || maxIndex == 0x7FFFFFFF)
				throw tcu::NotSupportedError("Implementation supports any attribute index");

			gl.glVertexAttribBinding(largeIndex, 0);
			break;
		}

		case CASE_INVALID_BINDING:
		{
			glw::GLint maxBindings = -1;
			glw::GLint largeBinding;

			gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &maxBindings);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");

			largeBinding = maxBindings + 1;

			// skip if maximum unsigned or signed values
			if (maxBindings == -1 || maxBindings == 0x7FFFFFFF)
				throw tcu::NotSupportedError("Implementation supports any binding");

			gl.glVertexAttribBinding(0, largeBinding);
			break;
		}

		default:
			DE_ASSERT(false);
	}

	error = gl.glGetError();

	if (error != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR! Expected GL_INVALID_VALUE, got " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid error");
	}
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}